

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5DlidxIterPrevR(Fts5Index *p,Fts5DlidxIter *pIter,int iLvl)

{
  long *plVar1;
  u8 *puVar2;
  Fts5DlidxLvl *pFVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  Fts5Data *pFVar7;
  Fts5Data *pFVar8;
  int iVar9;
  Fts5DlidxLvl *pLvl;
  int iVar10;
  long lVar11;
  u8 *puVar12;
  int iVar13;
  int iVar14;
  u64 local_38;
  
  pFVar7 = (Fts5Data *)((long)iLvl * 0x20);
  pFVar3 = pIter->aLvl;
  pLvl = (Fts5DlidxLvl *)((long)&pFVar7->p + (long)pFVar3);
  iVar14 = *(int *)((long)&pFVar7->nn + (long)pFVar3);
  uVar6 = *(uint *)((long)&pFVar7[1].p + (long)pFVar3);
  if ((int)uVar6 < iVar14) {
    iVar10 = 0;
    if (9 < iVar14) {
      iVar10 = iVar14 + -9;
    }
    puVar2 = pLvl->pData->p;
    iVar5 = iVar14 + -1;
    if (iVar10 <= iVar14 + -1) {
      iVar5 = iVar10;
    }
    lVar11 = (long)iVar14;
    do {
      iVar9 = iVar14;
      iVar14 = iVar5;
      iVar13 = iVar5 + 1;
      if (lVar11 + -1 <= (long)iVar10) break;
      iVar14 = iVar9 + -1;
      lVar4 = lVar11 + -2;
      iVar13 = iVar9;
      lVar11 = lVar11 + -1;
    } while ((char)puVar2[lVar4] < '\0');
    sqlite3Fts5GetVarint(puVar2 + iVar14,&local_38);
    plVar1 = (long *)((long)&pFVar7[1].nn + (long)pFVar3);
    *plVar1 = *plVar1 - local_38;
    iVar5 = *(int *)((long)&pFVar7[1].p + (long)((long)&pFVar3->pData + 4)) + -1;
    *(int *)((long)&pFVar7[1].p + (long)((long)&pFVar3->pData + 4)) = iVar5;
    iVar10 = 0;
    if ((int)uVar6 <= iVar13 + -2) {
      iVar10 = ~uVar6 + iVar13;
      puVar12 = puVar2 + (long)iVar13 + -2;
      lVar11 = ((long)iVar13 << 0x20) + -0x200000000;
      iVar9 = 0;
      do {
        if (*puVar12 != '\0') {
          iVar10 = iVar9;
          if ((char)puVar2[lVar11 >> 0x20] < '\0') {
            if ((iVar13 - iVar9) + -10 < (int)uVar6) goto LAB_001a6546;
            lVar11 = 8;
            goto LAB_001a655a;
          }
          break;
        }
        iVar9 = iVar9 + 1;
        lVar11 = lVar11 + -0x100000000;
        puVar12 = puVar12 + -1;
      } while (iVar10 != iVar9);
    }
    goto LAB_001a6566;
  }
  *(undefined4 *)((long)&pFVar7->szLeaf + (long)pFVar3) = 1;
  pFVar8 = pFVar7;
  goto LAB_001a6582;
LAB_001a6546:
  iVar10 = iVar9 + -1;
  goto LAB_001a6566;
  while (lVar11 = lVar11 + -1, lVar11 != 0) {
LAB_001a655a:
    if (-1 < (char)puVar2[lVar11 + (long)((iVar13 + -2) - iVar9) + -9]) goto LAB_001a6546;
  }
LAB_001a6566:
  uVar6 = iVar5 - iVar10;
  pFVar8 = (Fts5Data *)(ulong)uVar6;
  *(uint *)((long)&pFVar7[1].p + (long)((long)&pFVar3->pData + 4)) = uVar6;
  *(int *)((long)&pFVar7->nn + (long)pFVar3) = iVar14 - iVar10;
  if (*(int *)((long)&pFVar7->szLeaf + (long)pFVar3) != 0) {
LAB_001a6582:
    if (iLvl + 1 < pIter->nLvl) {
      uVar6 = fts5DlidxIterPrevR(p,pIter,iLvl + 1);
      pFVar8 = (Fts5Data *)(ulong)uVar6;
      if (*(int *)((long)&pFVar7[2].szLeaf + (long)pFVar3) == 0) {
        sqlite3_free(pLvl->pData);
        *(undefined8 *)((long)&pFVar7[1].p + (long)pFVar3) = 0;
        *(undefined8 *)((long)&pFVar7[1].nn + (long)pFVar3) = 0;
        pLvl->pData = (Fts5Data *)0x0;
        *(undefined8 *)((long)&pFVar7->nn + (long)pFVar3) = 0;
        pFVar8 = fts5DataRead(p,(long)iLvl * 0x80000000 + ((ulong)(uint)pIter->iSegid << 0x25) +
                                0x1000000000 +
                                (long)*(int *)((long)&pFVar7[3].p + (long)((long)&pFVar3->pData + 4)
                                              ));
        pLvl->pData = pFVar8;
        if (pFVar8 != (Fts5Data *)0x0) {
          do {
            uVar6 = fts5DlidxLvlNext(pLvl);
            pFVar8 = (Fts5Data *)(ulong)uVar6;
          } while (uVar6 == 0);
          *(undefined4 *)((long)&pFVar7->szLeaf + (long)pFVar3) = 0;
        }
      }
    }
  }
  return (int)pFVar8;
}

Assistant:

static int fts5DlidxIterPrevR(Fts5Index *p, Fts5DlidxIter *pIter, int iLvl){
  Fts5DlidxLvl *pLvl = &pIter->aLvl[iLvl];

  assert( iLvl<pIter->nLvl );
  if( fts5DlidxLvlPrev(pLvl) ){
    if( (iLvl+1) < pIter->nLvl ){
      fts5DlidxIterPrevR(p, pIter, iLvl+1);
      if( pLvl[1].bEof==0 ){
        fts5DataRelease(pLvl->pData);
        memset(pLvl, 0, sizeof(Fts5DlidxLvl));
        pLvl->pData = fts5DataRead(p, 
            FTS5_DLIDX_ROWID(pIter->iSegid, iLvl, pLvl[1].iLeafPgno)
        );
        if( pLvl->pData ){
          while( fts5DlidxLvlNext(pLvl)==0 );
          pLvl->bEof = 0;
        }
      }
    }
  }

  return pIter->aLvl[0].bEof;
}